

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint auto_choose_color_from_profile
               (LodePNGColorMode *mode_out,LodePNGColorMode *mode_in,LodePNGColorProfile *prof)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  LodePNGColorType LVar5;
  uint uVar6;
  LodePNGColorType LVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar8 = prof->numpixels;
  uVar2 = prof->key;
  uVar3 = prof->alpha;
  uVar1 = prof->bits;
  mode_out->key_defined = 0;
  uVar4 = 8;
  if (8 < uVar1) {
    uVar4 = uVar1;
  }
  if (uVar8 >= 0x11 || uVar2 == 0) {
    uVar4 = uVar1;
  }
  uVar1 = prof->numcolors;
  if ((ulong)uVar1 < 3) {
    uVar6 = 1;
  }
  else if (uVar1 < 5) {
    uVar6 = 2;
  }
  else {
    uVar6 = (uint)(0x10 < uVar1) * 4 + 4;
  }
  if (((uVar8 < (ulong)uVar1 * 2 || 0x100 < uVar1) || 8 < uVar4) ||
      uVar4 <= uVar6 && prof->colored == 0) {
    bVar9 = prof->colored != 0;
    mode_out->bitdepth = uVar4;
    LVar5 = bVar9 + 4 + (uint)bVar9;
    LVar7 = (uint)bVar9 * 2;
    if (uVar3 != 0) {
      LVar7 = LVar5;
    }
    if (uVar8 < 0x11 && uVar2 != 0) {
      LVar7 = LVar5;
    }
    mode_out->colortype = LVar7;
    uVar3 = 0;
    if (uVar2 != 0 && 0x10 < uVar8) {
      uVar2 = ~(-1 << ((byte)uVar4 & 0x1f));
      mode_out->key_r = prof->key_r & uVar2;
      mode_out->key_g = prof->key_g & uVar2;
      mode_out->key_b = prof->key_b & uVar2;
      mode_out->key_defined = 1;
      uVar3 = 0;
    }
  }
  else {
    lodepng_palette_clear(mode_out);
    uVar8 = 0;
    do {
      uVar3 = 0;
      if (uVar8 == prof->numcolors) break;
      uVar3 = lodepng_palette_add(mode_out,prof->palette[uVar8 * 4],prof->palette[uVar8 * 4 + 1],
                                  prof->palette[uVar8 * 4 + 2],prof->palette[uVar8 * 4 + 3]);
      uVar8 = uVar8 + 1;
    } while (uVar3 == 0);
    mode_out->colortype = LCT_PALETTE;
    mode_out->bitdepth = uVar6;
    if (((mode_in->colortype == LCT_PALETTE) && (mode_out->palettesize <= mode_in->palettesize)) &&
       (mode_in->bitdepth == uVar6)) {
      lodepng_palette_clear(mode_out);
      lodepng_color_mode_copy(mode_out,mode_in);
    }
  }
  return uVar3;
}

Assistant:

static unsigned auto_choose_color_from_profile(LodePNGColorMode* mode_out,
                                               const LodePNGColorMode* mode_in,
                                               const LodePNGColorProfile* prof)
{
  unsigned error = 0;
  unsigned palettebits, palette_ok;
  size_t i, n;
  size_t numpixels = prof->numpixels;

  unsigned alpha = prof->alpha;
  unsigned key = prof->key;
  unsigned bits = prof->bits;

  mode_out->key_defined = 0;

  if(key && numpixels <= 16)
  {
    alpha = 1; /*too few pixels to justify tRNS chunk overhead*/
    key = 0;
    if(bits < 8) bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
  }
  n = prof->numcolors;
  palettebits = n <= 2 ? 1 : (n <= 4 ? 2 : (n <= 16 ? 4 : 8));
  palette_ok = n <= 256 && bits <= 8;
  if(numpixels < n * 2) palette_ok = 0; /*don't add palette overhead if image has only a few pixels*/
  if(!prof->colored && bits <= palettebits) palette_ok = 0; /*grey is less overhead*/

  if(palette_ok)
  {
    const unsigned char* p = prof->palette;
    lodepng_palette_clear(mode_out); /*remove potential earlier palette*/
    for(i = 0; i != prof->numcolors; ++i)
    {
      error = lodepng_palette_add(mode_out, p[i * 4 + 0], p[i * 4 + 1], p[i * 4 + 2], p[i * 4 + 3]);
      if(error) break;
    }

    mode_out->colortype = LCT_PALETTE;
    mode_out->bitdepth = palettebits;

    if(mode_in->colortype == LCT_PALETTE && mode_in->palettesize >= mode_out->palettesize
        && mode_in->bitdepth == mode_out->bitdepth)
    {
      /*If input should have same palette colors, keep original to preserve its order and prevent conversion*/
      lodepng_color_mode_cleanup(mode_out);
      lodepng_color_mode_copy(mode_out, mode_in);
    }
  }
  else /*8-bit or 16-bit per channel*/
  {
    mode_out->bitdepth = bits;
    mode_out->colortype = alpha ? (prof->colored ? LCT_RGBA : LCT_GREY_ALPHA)
                                : (prof->colored ? LCT_RGB : LCT_GREY);

    if(key)
    {
      unsigned mask = (1u << mode_out->bitdepth) - 1u; /*profile always uses 16-bit, mask converts it*/
      mode_out->key_r = prof->key_r & mask;
      mode_out->key_g = prof->key_g & mask;
      mode_out->key_b = prof->key_b & mask;
      mode_out->key_defined = 1;
    }
  }

  return error;
}